

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::anon_unknown_1::ToJsonName(string *__return_storage_ptr__,string *input)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char character;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  bool capitalize_next;
  string *input_local;
  string *result;
  
  bVar1 = false;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    if (*pcVar3 == '_') {
      bVar1 = true;
    }
    else if (bVar1) {
      ToUpper(*pcVar3);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar1 = false;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToJsonName(const std::string& input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  return result;
}